

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

htmlStatus htmlNodeStatus(htmlNodePtr node,int legacy)

{
  xmlChar *pxVar1;
  int iVar2;
  htmlStatus hVar3;
  htmlElemDesc *elt;
  long lVar4;
  htmlElemDesc *phVar5;
  
  if (node == (htmlNodePtr)0x0) {
    hVar3 = HTML_INVALID;
  }
  else {
    if (node->type == XML_ATTRIBUTE_NODE) {
      pxVar1 = node->parent->name;
      phVar5 = (htmlElemDesc *)0x0;
      lVar4 = 0;
      do {
        iVar2 = xmlStrcasecmp(pxVar1,*(xmlChar **)((long)&html40ElementTable[0].name + lVar4));
        if (iVar2 == 0) {
          phVar5 = (htmlElemDesc *)((long)&html40ElementTable[0].name + lVar4);
          break;
        }
        lVar4 = lVar4 + 0x40;
      } while (lVar4 != 0x1700);
      hVar3 = htmlAttrAllowed(phVar5,node->name,legacy);
      return hVar3;
    }
    hVar3 = HTML_NA;
    if (node->type == XML_ELEMENT_NODE) {
      pxVar1 = node->parent->name;
      phVar5 = (htmlElemDesc *)0x0;
      lVar4 = 0;
      if (legacy == 0) {
        do {
          iVar2 = xmlStrcasecmp(pxVar1,*(xmlChar **)((long)&html40ElementTable[0].name + lVar4));
          if (iVar2 == 0) {
            phVar5 = (htmlElemDesc *)((long)&html40ElementTable[0].name + lVar4);
            break;
          }
          lVar4 = lVar4 + 0x40;
        } while (lVar4 != 0x1700);
        pxVar1 = node->name;
        elt = (htmlElemDesc *)0x0;
        lVar4 = 0;
        do {
          iVar2 = xmlStrcasecmp(pxVar1,*(xmlChar **)((long)&html40ElementTable[0].name + lVar4));
          if (iVar2 == 0) {
            elt = (htmlElemDesc *)((long)&html40ElementTable[0].name + lVar4);
            break;
          }
          lVar4 = lVar4 + 0x40;
        } while (lVar4 != 0x1700);
        hVar3 = htmlElementStatusHere(phVar5,elt);
        return hVar3;
      }
      do {
        iVar2 = xmlStrcasecmp(pxVar1,*(xmlChar **)((long)&html40ElementTable[0].name + lVar4));
        if (iVar2 == 0) {
          phVar5 = (htmlElemDesc *)((long)&html40ElementTable[0].name + lVar4);
          break;
        }
        lVar4 = lVar4 + 0x40;
      } while (lVar4 != 0x1700);
      iVar2 = htmlElementAllowedHere(phVar5,node->name);
      hVar3 = (uint)(iVar2 != 0) * 3 + HTML_INVALID;
    }
  }
  return hVar3;
}

Assistant:

htmlStatus
htmlNodeStatus(const htmlNodePtr node, int legacy) {
  if ( ! node )
    return HTML_INVALID ;

  switch ( node->type ) {
    case XML_ELEMENT_NODE:
      return legacy
	? ( htmlElementAllowedHere (
		htmlTagLookup(node->parent->name) , node->name
		) ? HTML_VALID : HTML_INVALID )
	: htmlElementStatusHere(
		htmlTagLookup(node->parent->name) ,
		htmlTagLookup(node->name) )
	;
    case XML_ATTRIBUTE_NODE:
      return htmlAttrAllowed(
	htmlTagLookup(node->parent->name) , node->name, legacy) ;
    default: return HTML_NA ;
  }
}